

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_str_remove_chars(nk_str *s,int len)

{
  ulong uVar1;
  int iVar2;
  nk_size nVar3;
  
  if (s == (nk_str *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x214a,"void nk_str_remove_chars(struct nk_str *, int)");
  }
  if (-1 < len) {
    uVar1 = (s->buffer).allocated;
    nVar3 = uVar1 - (uint)len;
    if ((uint)len <= uVar1) {
      if ((int)uVar1 < len) {
        __assert_fail("((int)s->buffer.allocated - (int)len) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                      ,0x214d,"void nk_str_remove_chars(struct nk_str *, int)");
      }
      (s->buffer).allocated = nVar3;
      iVar2 = nk_utf_len((char *)(s->buffer).memory.ptr,(int)nVar3);
      s->len = iVar2;
    }
    return;
  }
  __assert_fail("len >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x214b,"void nk_str_remove_chars(struct nk_str *, int)");
}

Assistant:

NK_API void
nk_str_remove_chars(struct nk_str *s, int len)
{
    NK_ASSERT(s);
    NK_ASSERT(len >= 0);
    if (!s || len < 0 || (nk_size)len > s->buffer.allocated) return;
    NK_ASSERT(((int)s->buffer.allocated - (int)len) >= 0);
    s->buffer.allocated -= (nk_size)len;
    s->len = nk_utf_len((char *)s->buffer.memory.ptr, (int)s->buffer.allocated);
}